

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void corruptSchema(InitData *pData,char **azObj,char *zExtra)

{
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  char *local_40;
  char *zObj;
  char *z;
  sqlite3 *db;
  char *zExtra_local;
  char **azObj_local;
  InitData *pData_local;
  
  db_00 = pData->db;
  if (db_00->mallocFailed == '\0') {
    if (*pData->pzErrMsg == (char *)0x0) {
      if ((pData->mInitFlags & 3) == 0) {
        if ((db_00->flags & 1) == 0) {
          if (azObj[1] == (char *)0x0) {
            local_40 = "?";
          }
          else {
            local_40 = azObj[1];
          }
          zObj = sqlite3MPrintf(db_00,"malformed database schema (%s)",local_40);
          if ((zExtra != (char *)0x0) && (*zExtra != '\0')) {
            zObj = sqlite3MPrintf(db_00,"%z - %s",zObj,zExtra);
          }
          *pData->pzErrMsg = zObj;
          iVar1 = sqlite3CorruptError(0x20dae);
          pData->rc = iVar1;
        }
        else {
          iVar1 = sqlite3CorruptError(0x20da7);
          pData->rc = iVar1;
        }
      }
      else {
        pcVar2 = sqlite3MPrintf(db_00,"error in %s %s after %s: %s",*azObj,azObj[1],
                                corruptSchema::azAlterType[(pData->mInitFlags & 3) - 1],zExtra);
        *pData->pzErrMsg = pcVar2;
        pData->rc = 1;
      }
    }
  }
  else {
    pData->rc = 7;
  }
  return;
}

Assistant:

static void corruptSchema(
  InitData *pData,     /* Initialization context */
  char **azObj,        /* Type and name of object being parsed */
  const char *zExtra   /* Error information */
){
  sqlite3 *db = pData->db;
  if( db->mallocFailed ){
    pData->rc = SQLITE_NOMEM_BKPT;
  }else if( pData->pzErrMsg[0]!=0 ){
    /* A error message has already been generated.  Do not overwrite it */
  }else if( pData->mInitFlags & (INITFLAG_AlterMask) ){
    static const char *azAlterType[] = {
       "rename",
       "drop column",
       "add column"
    };
    *pData->pzErrMsg = sqlite3MPrintf(db,
        "error in %s %s after %s: %s", azObj[0], azObj[1],
        azAlterType[(pData->mInitFlags&INITFLAG_AlterMask)-1],
        zExtra
    );
    pData->rc = SQLITE_ERROR;
  }else if( db->flags & SQLITE_WriteSchema ){
    pData->rc = SQLITE_CORRUPT_BKPT;
  }else{
    char *z;
    const char *zObj = azObj[1] ? azObj[1] : "?";
    z = sqlite3MPrintf(db, "malformed database schema (%s)", zObj);
    if( zExtra && zExtra[0] ) z = sqlite3MPrintf(db, "%z - %s", z, zExtra);
    *pData->pzErrMsg = z;
    pData->rc = SQLITE_CORRUPT_BKPT;
  }
}